

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

string * testing::internal::FormatDeathTestOutput(string *__return_storage_ptr__,string *output)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_30;
  size_t line_end;
  size_t at;
  string *local_18;
  string *output_local;
  string *ret;
  
  at._7_1_ = 0;
  local_18 = output;
  output_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  line_end = 0;
  while( true ) {
    local_30 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         (local_18,'\n',line_end);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,"[  DEATH   ] ");
    if (local_30 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_80,local_18,line_end,(local_30 - line_end) + 1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    line_end = local_30 + 1;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_60,local_18,line_end,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static ::std::string FormatDeathTestOutput(const ::std::string& output) {
  ::std::string ret;
  for (size_t at = 0;;) {
    const size_t line_end = output.find('\n', at);
    ret += "[  DEATH   ] ";
    if (line_end == ::std::string::npos) {
      ret += output.substr(at);
      break;
    }
    ret += output.substr(at, line_end + 1 - at);
    at = line_end + 1;
  }
  return ret;
}